

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O0

void * add_third_party_option(pcp_flow_t *f,void *cur)

{
  uint16_t uVar1;
  pcp_3rd_party_option_t *tp_op;
  void *cur_local;
  pcp_flow_t *f_local;
  
  *(undefined1 *)cur = 1;
  *(undefined1 *)((long)cur + 1) = 0;
  *(undefined8 *)((long)cur + 4) = *(undefined8 *)&(f->third_party_ip).__in6_u;
  *(undefined8 *)((long)cur + 0xc) = *(undefined8 *)((long)&(f->third_party_ip).__in6_u + 8);
  uVar1 = htons(0x10);
  *(uint16_t *)((long)cur + 2) = uVar1;
  return (void *)((long)cur + 0x14);
}

Assistant:

static void *add_third_party_option(pcp_flow_t *f, void *cur) {
    pcp_3rd_party_option_t *tp_op = (pcp_3rd_party_option_t *)cur;

    tp_op->option = PCP_OPTION_3RD_PARTY;
    tp_op->reserved = 0;
    memcpy(tp_op->ip, &f->third_party_ip, sizeof(f->third_party_ip));
    tp_op->len = htons(sizeof(*tp_op) - sizeof(pcp_options_hdr_t));
    cur = tp_op->next_data;

    return cur;
}